

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<8,_1,_true,_embree::avx::ArrayIntersector1<embree::avx::QuadMiIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  undefined4 uVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  Scene *pSVar4;
  float **ppfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  Geometry *pGVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  ulong uVar69;
  long lVar70;
  uint uVar71;
  ulong uVar72;
  ulong uVar73;
  ulong uVar74;
  RTCIntersectArguments *pRVar75;
  ulong uVar76;
  ulong *puVar77;
  ulong uVar78;
  ulong uVar79;
  ulong uVar80;
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  undefined1 auVar87 [32];
  float fVar96;
  float fVar103;
  float fVar104;
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  float fVar105;
  float fVar108;
  float fVar110;
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  float fVar106;
  float fVar107;
  float fVar109;
  undefined1 auVar102 [64];
  float fVar111;
  float fVar116;
  float fVar117;
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  float fVar118;
  undefined1 auVar114 [32];
  float fVar119;
  float fVar120;
  float fVar121;
  undefined1 auVar115 [64];
  float fVar122;
  float fVar123;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  undefined1 auVar128 [64];
  float fVar141;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  float fVar152;
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  undefined1 auVar156 [64];
  undefined1 auVar163 [64];
  undefined1 auVar164 [32];
  undefined1 auVar165 [64];
  undefined1 auVar166 [32];
  undefined1 auVar167 [64];
  float fVar168;
  float fVar169;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  undefined1 auVar170 [64];
  float fVar183;
  float fVar184;
  undefined1 auVar185 [32];
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  undefined1 auVar186 [64];
  undefined1 auVar199 [32];
  undefined1 auVar200 [64];
  undefined1 auVar201 [32];
  undefined1 auVar202 [64];
  float fVar203;
  float fVar204;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  undefined1 auVar205 [32];
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  int local_17e4;
  undefined8 local_17e0;
  float fStack_17d8;
  float fStack_17d4;
  float fStack_17d0;
  float fStack_17cc;
  float fStack_17c8;
  float fStack_17c4;
  long local_17b0;
  long local_17a8;
  undefined8 local_17a0;
  float fStack_1798;
  float fStack_1794;
  float fStack_1790;
  float fStack_178c;
  float fStack_1788;
  float fStack_1784;
  undefined4 local_1780;
  float local_177c;
  float local_1778;
  undefined4 local_1774;
  undefined4 local_1770;
  undefined4 local_176c;
  uint local_1768;
  uint local_1764;
  uint local_1760;
  RTCFilterFunctionNArguments local_1750;
  undefined1 local_1720 [32];
  undefined8 local_1700;
  float fStack_16f8;
  float fStack_16f4;
  float fStack_16f0;
  float fStack_16ec;
  float fStack_16e8;
  float fStack_16e4;
  undefined1 local_16e0 [32];
  undefined1 local_16c0 [32];
  undefined1 local_16a0 [32];
  undefined1 local_1680 [32];
  undefined1 local_1660 [32];
  undefined1 local_1640 [32];
  undefined1 local_1620 [32];
  undefined1 local_1600 [32];
  undefined1 local_15e0 [32];
  undefined1 local_15c0 [32];
  undefined1 local_15a0 [32];
  undefined1 local_1580 [32];
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [8];
  float fStack_1418;
  float fStack_1414;
  float fStack_1410;
  float fStack_140c;
  float fStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  float local_13c0;
  float fStack_13bc;
  float fStack_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float fStack_13ac;
  float fStack_13a8;
  float fStack_13a4;
  float local_13a0;
  float fStack_139c;
  float fStack_1398;
  float fStack_1394;
  float fStack_1390;
  float fStack_138c;
  float fStack_1388;
  float fStack_1384;
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  float local_1260 [4];
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  undefined4 uStack_1244;
  float local_1240 [4];
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  undefined4 uStack_1224;
  undefined1 local_1220 [32];
  ulong local_1200;
  ulong local_11f8 [569];
  undefined1 auVar145 [64];
  
  local_1200 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_1200 != 8) {
    fVar1 = ray->tfar;
    if (0.0 <= fVar1) {
      puVar77 = local_11f8;
      auVar20 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      aVar3 = (ray->dir).field_0;
      auVar81._8_4_ = 0x7fffffff;
      auVar81._0_8_ = 0x7fffffff7fffffff;
      auVar81._12_4_ = 0x7fffffff;
      auVar81 = vandps_avx((undefined1  [16])aVar3,auVar81);
      auVar124._8_4_ = 0x219392ef;
      auVar124._0_8_ = 0x219392ef219392ef;
      auVar124._12_4_ = 0x219392ef;
      auVar81 = vcmpps_avx(auVar81,auVar124,1);
      auVar125._8_4_ = 0x3f800000;
      auVar125._0_8_ = 0x3f8000003f800000;
      auVar125._12_4_ = 0x3f800000;
      auVar124 = vdivps_avx(auVar125,(undefined1  [16])aVar3);
      auVar126._8_4_ = 0x5d5e0b6b;
      auVar126._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar126._12_4_ = 0x5d5e0b6b;
      auVar81 = vblendvps_avx(auVar124,auVar126,auVar81);
      auVar112._0_4_ = auVar81._0_4_ * 0.99999964;
      auVar112._4_4_ = auVar81._4_4_ * 0.99999964;
      auVar112._8_4_ = auVar81._8_4_ * 0.99999964;
      auVar112._12_4_ = auVar81._12_4_ * 0.99999964;
      auVar97._0_4_ = auVar81._0_4_ * 1.0000004;
      auVar97._4_4_ = auVar81._4_4_ * 1.0000004;
      auVar97._8_4_ = auVar81._8_4_ * 1.0000004;
      auVar97._12_4_ = auVar81._12_4_ * 1.0000004;
      uVar2 = *(undefined4 *)&(ray->org).field_0;
      auVar156 = ZEXT3264(CONCAT428(uVar2,CONCAT424(uVar2,CONCAT420(uVar2,CONCAT416(uVar2,CONCAT412(
                                                  uVar2,CONCAT48(uVar2,CONCAT44(uVar2,uVar2))))))));
      uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      auVar163 = ZEXT3264(CONCAT428(uVar2,CONCAT424(uVar2,CONCAT420(uVar2,CONCAT416(uVar2,CONCAT412(
                                                  uVar2,CONCAT48(uVar2,CONCAT44(uVar2,uVar2))))))));
      uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      auVar165 = ZEXT3264(CONCAT428(uVar2,CONCAT424(uVar2,CONCAT420(uVar2,CONCAT416(uVar2,CONCAT412(
                                                  uVar2,CONCAT48(uVar2,CONCAT44(uVar2,uVar2))))))));
      auVar81 = vshufps_avx(auVar112,auVar112,0);
      auVar167 = ZEXT3264(CONCAT1616(auVar81,auVar81));
      auVar81 = vmovshdup_avx(auVar112);
      auVar124 = vshufps_avx(auVar112,auVar112,0x55);
      auVar170 = ZEXT3264(CONCAT1616(auVar124,auVar124));
      auVar124 = vshufpd_avx(auVar112,auVar112,1);
      auVar125 = vshufps_avx(auVar112,auVar112,0xaa);
      auVar186 = ZEXT3264(CONCAT1616(auVar125,auVar125));
      auVar125 = vshufps_avx(auVar97,auVar97,0);
      auVar200 = ZEXT3264(CONCAT1616(auVar125,auVar125));
      auVar125 = vshufps_avx(auVar97,auVar97,0x55);
      auVar115 = ZEXT3264(CONCAT1616(auVar125,auVar125));
      auVar125 = vshufps_avx(auVar97,auVar97,0xaa);
      auVar102 = ZEXT3264(CONCAT1616(auVar125,auVar125));
      uVar78 = (ulong)(auVar112._0_4_ < 0.0) << 5;
      uVar74 = (ulong)(auVar81._0_4_ < 0.0) << 5 | 0x40;
      uVar73 = (ulong)(auVar124._0_4_ < 0.0) << 5 | 0x80;
      uVar80 = uVar78 ^ 0x20;
      auVar81 = vshufps_avx(auVar20,auVar20,0);
      auVar128 = ZEXT3264(CONCAT1616(auVar81,auVar81));
      auVar81 = vshufps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0);
      auVar142._16_16_ = mm_lookupmask_ps._240_16_;
      auVar142._0_16_ = mm_lookupmask_ps._0_16_;
      auVar145 = ZEXT3264(auVar142);
      auVar202 = ZEXT3264(CONCAT1616(auVar81,auVar81));
      auVar84._8_4_ = 0x3f800000;
      auVar84._0_8_ = 0x3f8000003f800000;
      auVar84._12_4_ = 0x3f800000;
      auVar84._16_4_ = 0x3f800000;
      auVar84._20_4_ = 0x3f800000;
      auVar84._24_4_ = 0x3f800000;
      auVar84._28_4_ = 0x3f800000;
      auVar82._8_4_ = 0xbf800000;
      auVar82._0_8_ = 0xbf800000bf800000;
      auVar82._12_4_ = 0xbf800000;
      auVar82._16_4_ = 0xbf800000;
      auVar82._20_4_ = 0xbf800000;
      auVar82._24_4_ = 0xbf800000;
      auVar82._28_4_ = 0xbf800000;
      _local_1420 = vblendvps_avx(auVar84,auVar82,auVar142);
      do {
        uVar79 = puVar77[-1];
        puVar77 = puVar77 + -1;
        local_1500 = auVar156._0_32_;
        local_1520 = auVar163._0_32_;
        local_1540 = auVar165._0_32_;
        while ((uVar79 & 8) == 0) {
          auVar82 = vsubps_avx(*(undefined1 (*) [32])(uVar79 + 0x40 + uVar78),local_1500);
          auVar21._4_4_ = auVar167._4_4_ * auVar82._4_4_;
          auVar21._0_4_ = auVar167._0_4_ * auVar82._0_4_;
          auVar21._8_4_ = auVar167._8_4_ * auVar82._8_4_;
          auVar21._12_4_ = auVar167._12_4_ * auVar82._12_4_;
          auVar21._16_4_ = auVar167._16_4_ * auVar82._16_4_;
          auVar21._20_4_ = auVar167._20_4_ * auVar82._20_4_;
          auVar21._24_4_ = auVar167._24_4_ * auVar82._24_4_;
          auVar21._28_4_ = auVar82._28_4_;
          auVar82 = vsubps_avx(*(undefined1 (*) [32])(uVar79 + 0x40 + uVar74),local_1520);
          auVar22._4_4_ = auVar170._4_4_ * auVar82._4_4_;
          auVar22._0_4_ = auVar170._0_4_ * auVar82._0_4_;
          auVar22._8_4_ = auVar170._8_4_ * auVar82._8_4_;
          auVar22._12_4_ = auVar170._12_4_ * auVar82._12_4_;
          auVar22._16_4_ = auVar170._16_4_ * auVar82._16_4_;
          auVar22._20_4_ = auVar170._20_4_ * auVar82._20_4_;
          auVar22._24_4_ = auVar170._24_4_ * auVar82._24_4_;
          auVar22._28_4_ = auVar82._28_4_;
          auVar82 = vmaxps_avx(auVar21,auVar22);
          auVar84 = vsubps_avx(*(undefined1 (*) [32])(uVar79 + 0x40 + uVar73),local_1540);
          auVar23._4_4_ = auVar186._4_4_ * auVar84._4_4_;
          auVar23._0_4_ = auVar186._0_4_ * auVar84._0_4_;
          auVar23._8_4_ = auVar186._8_4_ * auVar84._8_4_;
          auVar23._12_4_ = auVar186._12_4_ * auVar84._12_4_;
          auVar23._16_4_ = auVar186._16_4_ * auVar84._16_4_;
          auVar23._20_4_ = auVar186._20_4_ * auVar84._20_4_;
          auVar23._24_4_ = auVar186._24_4_ * auVar84._24_4_;
          auVar23._28_4_ = auVar84._28_4_;
          auVar84 = vmaxps_avx(auVar23,auVar128._0_32_);
          auVar82 = vmaxps_avx(auVar82,auVar84);
          auVar84 = vsubps_avx(*(undefined1 (*) [32])(uVar79 + 0x40 + uVar80),local_1500);
          auVar24._4_4_ = auVar200._4_4_ * auVar84._4_4_;
          auVar24._0_4_ = auVar200._0_4_ * auVar84._0_4_;
          auVar24._8_4_ = auVar200._8_4_ * auVar84._8_4_;
          auVar24._12_4_ = auVar200._12_4_ * auVar84._12_4_;
          auVar24._16_4_ = auVar200._16_4_ * auVar84._16_4_;
          auVar24._20_4_ = auVar200._20_4_ * auVar84._20_4_;
          auVar24._24_4_ = auVar200._24_4_ * auVar84._24_4_;
          auVar24._28_4_ = auVar84._28_4_;
          auVar84 = vsubps_avx(*(undefined1 (*) [32])(uVar79 + 0x40 + (uVar74 ^ 0x20)),local_1520);
          auVar25._4_4_ = auVar115._4_4_ * auVar84._4_4_;
          auVar25._0_4_ = auVar115._0_4_ * auVar84._0_4_;
          auVar25._8_4_ = auVar115._8_4_ * auVar84._8_4_;
          auVar25._12_4_ = auVar115._12_4_ * auVar84._12_4_;
          auVar25._16_4_ = auVar115._16_4_ * auVar84._16_4_;
          auVar25._20_4_ = auVar115._20_4_ * auVar84._20_4_;
          auVar25._24_4_ = auVar115._24_4_ * auVar84._24_4_;
          auVar25._28_4_ = auVar84._28_4_;
          auVar84 = vminps_avx(auVar24,auVar25);
          auVar142 = vsubps_avx(*(undefined1 (*) [32])(uVar79 + 0x40 + (uVar73 ^ 0x20)),local_1540);
          auVar26._4_4_ = auVar102._4_4_ * auVar142._4_4_;
          auVar26._0_4_ = auVar102._0_4_ * auVar142._0_4_;
          auVar26._8_4_ = auVar102._8_4_ * auVar142._8_4_;
          auVar26._12_4_ = auVar102._12_4_ * auVar142._12_4_;
          auVar26._16_4_ = auVar102._16_4_ * auVar142._16_4_;
          auVar26._20_4_ = auVar102._20_4_ * auVar142._20_4_;
          auVar26._24_4_ = auVar102._24_4_ * auVar142._24_4_;
          auVar26._28_4_ = auVar142._28_4_;
          auVar142 = vminps_avx(auVar26,auVar202._0_32_);
          auVar84 = vminps_avx(auVar84,auVar142);
          auVar82 = vcmpps_avx(auVar82,auVar84,2);
          uVar71 = vmovmskps_avx(auVar82);
          if (uVar71 == 0) goto LAB_002ec2e5;
          uVar69 = uVar79 & 0xfffffffffffffff0;
          lVar11 = 0;
          if ((byte)uVar71 != 0) {
            for (; ((byte)uVar71 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
            }
          }
          uVar79 = *(ulong *)(uVar69 + lVar11 * 8);
          uVar71 = (uVar71 & 0xff) - 1 & uVar71 & 0xff;
          if (uVar71 != 0) {
            *puVar77 = uVar79;
            puVar77 = puVar77 + 1;
            lVar11 = 0;
            if (uVar71 != 0) {
              for (; (uVar71 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
              }
            }
            uVar79 = *(ulong *)(uVar69 + lVar11 * 8);
            uVar71 = uVar71 - 1 & uVar71;
            uVar72 = (ulong)uVar71;
            if (uVar71 != 0) {
              do {
                *puVar77 = uVar79;
                puVar77 = puVar77 + 1;
                lVar11 = 0;
                if (uVar72 != 0) {
                  for (; (uVar72 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
                  }
                }
                uVar79 = *(ulong *)(uVar69 + lVar11 * 8);
                uVar72 = uVar72 & uVar72 - 1;
              } while (uVar72 != 0);
            }
          }
        }
        local_17b0 = (ulong)((uint)uVar79 & 0xf) - 8;
        if (local_17b0 != 0) {
          uVar79 = uVar79 & 0xfffffffffffffff0;
          pSVar4 = context->scene;
          local_17a8 = 0;
          local_1560 = auVar167._0_32_;
          local_1580 = auVar170._0_32_;
          local_15a0 = auVar186._0_32_;
          local_15c0 = auVar200._0_32_;
          local_15e0 = auVar115._0_32_;
          local_1600 = auVar102._0_32_;
          local_1620 = auVar128._0_32_;
          local_1640 = auVar145._0_32_;
          local_1660 = auVar202._0_32_;
          do {
            lVar70 = local_17a8 * 0x60;
            ppfVar5 = (pSVar4->vertices).items;
            pfVar6 = ppfVar5[*(uint *)(uVar79 + 0x40 + lVar70)];
            pfVar7 = ppfVar5[*(uint *)(uVar79 + 0x44 + lVar70)];
            pfVar8 = ppfVar5[*(uint *)(uVar79 + 0x48 + lVar70)];
            pfVar9 = ppfVar5[*(uint *)(uVar79 + 0x4c + lVar70)];
            auVar20 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar79 + lVar70)),
                                    *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar79 + 8 + lVar70)))
            ;
            auVar81 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar79 + lVar70)),
                                    *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar79 + 8 + lVar70)))
            ;
            auVar125 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar79 + 4 + lVar70))
                                     ,*(undefined1 (*) [16])
                                       (pfVar9 + *(uint *)(uVar79 + 0xc + lVar70)));
            auVar124 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar79 + 4 + lVar70))
                                     ,*(undefined1 (*) [16])
                                       (pfVar9 + *(uint *)(uVar79 + 0xc + lVar70)));
            auVar112 = vunpcklps_avx(auVar81,auVar124);
            auVar126 = vunpcklps_avx(auVar20,auVar125);
            auVar81 = vunpckhps_avx(auVar20,auVar125);
            auVar125 = vunpcklps_avx(*(undefined1 (*) [16])
                                      (pfVar6 + *(uint *)(uVar79 + 0x10 + lVar70)),
                                     *(undefined1 (*) [16])
                                      (pfVar8 + *(uint *)(uVar79 + 0x18 + lVar70)));
            auVar124 = vunpckhps_avx(*(undefined1 (*) [16])
                                      (pfVar6 + *(uint *)(uVar79 + 0x10 + lVar70)),
                                     *(undefined1 (*) [16])
                                      (pfVar8 + *(uint *)(uVar79 + 0x18 + lVar70)));
            auVar97 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar79 + 0x14 + lVar70)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar79 + 0x1c + lVar70)));
            auVar20 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar79 + 0x14 + lVar70)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar79 + 0x1c + lVar70)));
            auVar28 = vunpcklps_avx(auVar124,auVar20);
            auVar29 = vunpcklps_avx(auVar125,auVar97);
            auVar124 = vunpckhps_avx(auVar125,auVar97);
            auVar97 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar79 + 0x20 + lVar70)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar79 + 0x28 + lVar70)));
            auVar20 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar79 + 0x20 + lVar70)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar79 + 0x28 + lVar70)));
            auVar30 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar79 + 0x24 + lVar70)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar79 + 0x2c + lVar70)));
            auVar125 = vunpckhps_avx(*(undefined1 (*) [16])
                                      (pfVar7 + *(uint *)(uVar79 + 0x24 + lVar70)),
                                     *(undefined1 (*) [16])
                                      (pfVar9 + *(uint *)(uVar79 + 0x2c + lVar70)));
            auVar31 = vunpcklps_avx(auVar20,auVar125);
            auVar32 = vunpcklps_avx(auVar97,auVar30);
            auVar20 = vunpckhps_avx(auVar97,auVar30);
            auVar30 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar79 + 0x30 + lVar70)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar79 + 0x38 + lVar70)));
            auVar125 = vunpckhps_avx(*(undefined1 (*) [16])
                                      (pfVar6 + *(uint *)(uVar79 + 0x30 + lVar70)),
                                     *(undefined1 (*) [16])
                                      (pfVar8 + *(uint *)(uVar79 + 0x38 + lVar70)));
            auVar33 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar79 + 0x34 + lVar70)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar79 + 0x3c + lVar70)));
            auVar97 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar79 + 0x34 + lVar70)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar79 + 0x3c + lVar70)));
            auVar97 = vunpcklps_avx(auVar125,auVar97);
            auVar34 = vunpcklps_avx(auVar30,auVar33);
            lVar11 = uVar79 + 0x40 + lVar70;
            local_13e0 = *(undefined8 *)(lVar11 + 0x10);
            uStack_13d8 = *(undefined8 *)(lVar11 + 0x18);
            auVar125 = vunpckhps_avx(auVar30,auVar33);
            uStack_13d0 = local_13e0;
            uStack_13c8 = uStack_13d8;
            lVar70 = uVar79 + 0x50 + lVar70;
            local_1400 = *(undefined8 *)(lVar70 + 0x10);
            uStack_13f8 = *(undefined8 *)(lVar70 + 0x18);
            uStack_13f0 = local_1400;
            uStack_13e8 = uStack_13f8;
            auVar205._16_16_ = auVar32;
            auVar205._0_16_ = auVar126;
            auVar153._16_16_ = auVar20;
            auVar153._0_16_ = auVar81;
            auVar83._16_16_ = auVar31;
            auVar83._0_16_ = auVar112;
            auVar113._16_16_ = auVar29;
            auVar113._0_16_ = auVar29;
            auVar127._16_16_ = auVar124;
            auVar127._0_16_ = auVar124;
            auVar85._16_16_ = auVar28;
            auVar85._0_16_ = auVar28;
            auVar164._16_16_ = auVar34;
            auVar164._0_16_ = auVar34;
            auVar166._16_16_ = auVar125;
            auVar166._0_16_ = auVar125;
            auVar98._16_16_ = auVar97;
            auVar98._0_16_ = auVar97;
            uVar2 = *(undefined4 *)&(ray->org).field_0;
            auVar185._4_4_ = uVar2;
            auVar185._0_4_ = uVar2;
            auVar185._8_4_ = uVar2;
            auVar185._12_4_ = uVar2;
            auVar185._16_4_ = uVar2;
            auVar185._20_4_ = uVar2;
            auVar185._24_4_ = uVar2;
            auVar185._28_4_ = uVar2;
            uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
            auVar199._4_4_ = uVar2;
            auVar199._0_4_ = uVar2;
            auVar199._8_4_ = uVar2;
            auVar199._12_4_ = uVar2;
            auVar199._16_4_ = uVar2;
            auVar199._20_4_ = uVar2;
            auVar199._24_4_ = uVar2;
            auVar199._28_4_ = uVar2;
            uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
            auVar201._4_4_ = uVar2;
            auVar201._0_4_ = uVar2;
            auVar201._8_4_ = uVar2;
            auVar201._12_4_ = uVar2;
            auVar201._16_4_ = uVar2;
            auVar201._20_4_ = uVar2;
            auVar201._24_4_ = uVar2;
            auVar201._28_4_ = uVar2;
            local_1680 = vsubps_avx(auVar205,auVar185);
            local_16a0 = vsubps_avx(auVar153,auVar199);
            local_16c0 = vsubps_avx(auVar83,auVar201);
            auVar82 = vsubps_avx(auVar113,auVar185);
            auVar84 = vsubps_avx(auVar127,auVar199);
            auVar142 = vsubps_avx(auVar85,auVar201);
            auVar21 = vsubps_avx(auVar164,auVar185);
            auVar22 = vsubps_avx(auVar166,auVar199);
            auVar23 = vsubps_avx(auVar98,auVar201);
            local_16e0 = vsubps_avx(auVar21,local_1680);
            local_1440 = vsubps_avx(auVar22,local_16a0);
            local_1460 = vsubps_avx(auVar23,local_16c0);
            fVar203 = local_16a0._0_4_;
            fVar111 = fVar203 + auVar22._0_4_;
            fVar206 = local_16a0._4_4_;
            fVar116 = fVar206 + auVar22._4_4_;
            fVar208 = local_16a0._8_4_;
            fVar117 = fVar208 + auVar22._8_4_;
            fVar210 = local_16a0._12_4_;
            fVar118 = fVar210 + auVar22._12_4_;
            fVar212 = local_16a0._16_4_;
            fVar119 = fVar212 + auVar22._16_4_;
            fVar214 = local_16a0._20_4_;
            fVar120 = fVar214 + auVar22._20_4_;
            fVar216 = local_16a0._24_4_;
            fVar121 = fVar216 + auVar22._24_4_;
            fVar90 = local_16a0._28_4_;
            fVar1 = local_16c0._0_4_;
            fVar122 = auVar23._0_4_ + fVar1;
            fVar13 = local_16c0._4_4_;
            fVar129 = auVar23._4_4_ + fVar13;
            fVar15 = local_16c0._8_4_;
            fVar131 = auVar23._8_4_ + fVar15;
            fVar17 = local_16c0._12_4_;
            fVar133 = auVar23._12_4_ + fVar17;
            fVar89 = local_16c0._16_4_;
            fVar135 = auVar23._16_4_ + fVar89;
            fVar93 = local_16c0._20_4_;
            fVar137 = auVar23._20_4_ + fVar93;
            fVar18 = local_16c0._24_4_;
            fVar139 = auVar23._24_4_ + fVar18;
            fVar141 = local_1460._0_4_;
            fVar146 = local_1460._4_4_;
            auVar27._4_4_ = fVar146 * fVar116;
            auVar27._0_4_ = fVar141 * fVar111;
            fVar147 = local_1460._8_4_;
            auVar27._8_4_ = fVar147 * fVar117;
            fVar148 = local_1460._12_4_;
            auVar27._12_4_ = fVar148 * fVar118;
            fVar149 = local_1460._16_4_;
            auVar27._16_4_ = fVar149 * fVar119;
            fVar150 = local_1460._20_4_;
            auVar27._20_4_ = fVar150 * fVar120;
            fVar151 = local_1460._24_4_;
            auVar27._24_4_ = fVar151 * fVar121;
            auVar27._28_4_ = auVar20._12_4_;
            fVar183 = local_1440._0_4_;
            fVar187 = local_1440._4_4_;
            auVar35._4_4_ = fVar187 * fVar129;
            auVar35._0_4_ = fVar183 * fVar122;
            fVar189 = local_1440._8_4_;
            auVar35._8_4_ = fVar189 * fVar131;
            fVar191 = local_1440._12_4_;
            auVar35._12_4_ = fVar191 * fVar133;
            fVar193 = local_1440._16_4_;
            auVar35._16_4_ = fVar193 * fVar135;
            fVar195 = local_1440._20_4_;
            auVar35._20_4_ = fVar195 * fVar137;
            fVar197 = local_1440._24_4_;
            auVar35._24_4_ = fVar197 * fVar139;
            auVar35._28_4_ = auVar34._12_4_;
            auVar24 = vsubps_avx(auVar35,auVar27);
            fVar12 = local_1680._0_4_;
            fVar152 = auVar21._0_4_ + fVar12;
            fVar14 = local_1680._4_4_;
            fVar157 = auVar21._4_4_ + fVar14;
            fVar16 = local_1680._8_4_;
            fVar158 = auVar21._8_4_ + fVar16;
            fVar88 = local_1680._12_4_;
            fVar159 = auVar21._12_4_ + fVar88;
            fVar91 = local_1680._16_4_;
            fVar160 = auVar21._16_4_ + fVar91;
            fVar95 = local_1680._20_4_;
            fVar161 = auVar21._20_4_ + fVar95;
            fVar19 = local_1680._24_4_;
            fVar162 = auVar21._24_4_ + fVar19;
            fVar96 = local_16e0._0_4_;
            fVar103 = local_16e0._4_4_;
            auVar36._4_4_ = fVar103 * fVar129;
            auVar36._0_4_ = fVar96 * fVar122;
            fVar104 = local_16e0._8_4_;
            auVar36._8_4_ = fVar104 * fVar131;
            fVar105 = local_16e0._12_4_;
            auVar36._12_4_ = fVar105 * fVar133;
            fVar106 = local_16e0._16_4_;
            auVar36._16_4_ = fVar106 * fVar135;
            fVar107 = local_16e0._20_4_;
            auVar36._20_4_ = fVar107 * fVar137;
            fVar109 = local_16e0._24_4_;
            auVar36._24_4_ = fVar109 * fVar139;
            auVar36._28_4_ = auVar23._28_4_ + local_16c0._28_4_;
            auVar35 = local_1460;
            auVar37._4_4_ = fVar146 * fVar157;
            auVar37._0_4_ = fVar141 * fVar152;
            auVar37._8_4_ = fVar147 * fVar158;
            auVar37._12_4_ = fVar148 * fVar159;
            auVar37._16_4_ = fVar149 * fVar160;
            auVar37._20_4_ = fVar150 * fVar161;
            auVar37._24_4_ = fVar151 * fVar162;
            auVar37._28_4_ = auVar125._12_4_;
            auVar25 = vsubps_avx(auVar37,auVar36);
            auVar38._4_4_ = fVar187 * fVar157;
            auVar38._0_4_ = fVar183 * fVar152;
            auVar38._8_4_ = fVar189 * fVar158;
            auVar38._12_4_ = fVar191 * fVar159;
            auVar38._16_4_ = fVar193 * fVar160;
            auVar38._20_4_ = fVar195 * fVar161;
            auVar38._24_4_ = fVar197 * fVar162;
            auVar38._28_4_ = auVar21._28_4_ + local_1680._28_4_;
            auVar39._4_4_ = fVar103 * fVar116;
            auVar39._0_4_ = fVar96 * fVar111;
            auVar39._8_4_ = fVar104 * fVar117;
            auVar39._12_4_ = fVar105 * fVar118;
            auVar39._16_4_ = fVar106 * fVar119;
            auVar39._20_4_ = fVar107 * fVar120;
            auVar39._24_4_ = fVar109 * fVar121;
            auVar39._28_4_ = fVar90 + auVar22._28_4_;
            auVar26 = vsubps_avx(auVar39,auVar38);
            local_17e0._4_4_ = (ray->dir).field_0.m128[1];
            local_1700._4_4_ = (ray->dir).field_0.m128[2];
            local_17a0._4_4_ = (ray->dir).field_0.m128[0];
            local_1720._0_4_ =
                 local_17a0._4_4_ * auVar24._0_4_ +
                 local_17e0._4_4_ * auVar25._0_4_ + local_1700._4_4_ * auVar26._0_4_;
            local_1720._4_4_ =
                 local_17a0._4_4_ * auVar24._4_4_ +
                 local_17e0._4_4_ * auVar25._4_4_ + local_1700._4_4_ * auVar26._4_4_;
            local_1720._8_4_ =
                 local_17a0._4_4_ * auVar24._8_4_ +
                 local_17e0._4_4_ * auVar25._8_4_ + local_1700._4_4_ * auVar26._8_4_;
            local_1720._12_4_ =
                 local_17a0._4_4_ * auVar24._12_4_ +
                 local_17e0._4_4_ * auVar25._12_4_ + local_1700._4_4_ * auVar26._12_4_;
            local_1720._16_4_ =
                 local_17a0._4_4_ * auVar24._16_4_ +
                 local_17e0._4_4_ * auVar25._16_4_ + local_1700._4_4_ * auVar26._16_4_;
            local_1720._20_4_ =
                 local_17a0._4_4_ * auVar24._20_4_ +
                 local_17e0._4_4_ * auVar25._20_4_ + local_1700._4_4_ * auVar26._20_4_;
            local_1720._24_4_ =
                 local_17a0._4_4_ * auVar24._24_4_ +
                 local_17e0._4_4_ * auVar25._24_4_ + local_1700._4_4_ * auVar26._24_4_;
            local_1720._28_4_ = auVar25._28_4_ + auVar25._28_4_ + auVar26._28_4_;
            auVar24 = vsubps_avx(local_16a0,auVar84);
            local_1480 = vsubps_avx(local_16c0,auVar142);
            fVar117 = fVar203 + auVar84._0_4_;
            fVar118 = fVar206 + auVar84._4_4_;
            fVar119 = fVar208 + auVar84._8_4_;
            fVar120 = fVar210 + auVar84._12_4_;
            fVar121 = fVar212 + auVar84._16_4_;
            fVar122 = fVar214 + auVar84._20_4_;
            fVar129 = fVar216 + auVar84._24_4_;
            fVar111 = auVar84._28_4_;
            fVar131 = fVar1 + auVar142._0_4_;
            fVar133 = fVar13 + auVar142._4_4_;
            fVar135 = fVar15 + auVar142._8_4_;
            fVar137 = fVar17 + auVar142._12_4_;
            fVar139 = fVar89 + auVar142._16_4_;
            fVar152 = fVar93 + auVar142._20_4_;
            fVar157 = fVar18 + auVar142._24_4_;
            fVar116 = auVar142._28_4_;
            fVar184 = local_1480._0_4_;
            fVar188 = local_1480._4_4_;
            auVar40._4_4_ = fVar188 * fVar118;
            auVar40._0_4_ = fVar184 * fVar117;
            fVar190 = local_1480._8_4_;
            auVar40._8_4_ = fVar190 * fVar119;
            fVar192 = local_1480._12_4_;
            auVar40._12_4_ = fVar192 * fVar120;
            fVar194 = local_1480._16_4_;
            auVar40._16_4_ = fVar194 * fVar121;
            fVar196 = local_1480._20_4_;
            auVar40._20_4_ = fVar196 * fVar122;
            fVar198 = local_1480._24_4_;
            auVar40._24_4_ = fVar198 * fVar129;
            auVar40._28_4_ = fVar90;
            fVar168 = auVar24._0_4_;
            fVar171 = auVar24._4_4_;
            auVar41._4_4_ = fVar171 * fVar133;
            auVar41._0_4_ = fVar168 * fVar131;
            fVar173 = auVar24._8_4_;
            auVar41._8_4_ = fVar173 * fVar135;
            fVar175 = auVar24._12_4_;
            auVar41._12_4_ = fVar175 * fVar137;
            fVar177 = auVar24._16_4_;
            auVar41._16_4_ = fVar177 * fVar139;
            fVar179 = auVar24._20_4_;
            auVar41._20_4_ = fVar179 * fVar152;
            fVar181 = auVar24._24_4_;
            auVar41._24_4_ = fVar181 * fVar157;
            auVar41._28_4_ = fVar116;
            auVar25 = vsubps_avx(auVar41,auVar40);
            auVar26 = vsubps_avx(local_1680,auVar82);
            fVar204 = auVar26._0_4_;
            fVar207 = auVar26._4_4_;
            auVar42._4_4_ = fVar207 * fVar133;
            auVar42._0_4_ = fVar204 * fVar131;
            fVar209 = auVar26._8_4_;
            auVar42._8_4_ = fVar209 * fVar135;
            fVar211 = auVar26._12_4_;
            auVar42._12_4_ = fVar211 * fVar137;
            fVar213 = auVar26._16_4_;
            auVar42._16_4_ = fVar213 * fVar139;
            fVar215 = auVar26._20_4_;
            auVar42._20_4_ = fVar215 * fVar152;
            fVar217 = auVar26._24_4_;
            auVar42._24_4_ = fVar217 * fVar157;
            auVar42._28_4_ = local_16c0._28_4_ + fVar116;
            fVar131 = fVar12 + auVar82._0_4_;
            fVar133 = fVar14 + auVar82._4_4_;
            fVar135 = fVar16 + auVar82._8_4_;
            fVar137 = fVar88 + auVar82._12_4_;
            fVar139 = fVar91 + auVar82._16_4_;
            fVar152 = fVar95 + auVar82._20_4_;
            fVar157 = fVar19 + auVar82._24_4_;
            auVar43._4_4_ = fVar188 * fVar133;
            auVar43._0_4_ = fVar184 * fVar131;
            auVar43._8_4_ = fVar190 * fVar135;
            auVar43._12_4_ = fVar192 * fVar137;
            auVar43._16_4_ = fVar194 * fVar139;
            auVar43._20_4_ = fVar196 * fVar152;
            auVar43._24_4_ = fVar198 * fVar157;
            auVar43._28_4_ = local_1480._28_4_;
            auVar26 = vsubps_avx(auVar43,auVar42);
            auVar44._4_4_ = fVar171 * fVar133;
            auVar44._0_4_ = fVar168 * fVar131;
            auVar44._8_4_ = fVar173 * fVar135;
            auVar44._12_4_ = fVar175 * fVar137;
            auVar44._16_4_ = fVar177 * fVar139;
            auVar44._20_4_ = fVar179 * fVar152;
            auVar44._24_4_ = fVar181 * fVar157;
            auVar44._28_4_ = local_1680._28_4_ + auVar82._28_4_;
            auVar45._4_4_ = fVar207 * fVar118;
            auVar45._0_4_ = fVar204 * fVar117;
            auVar45._8_4_ = fVar209 * fVar119;
            auVar45._12_4_ = fVar211 * fVar120;
            auVar45._16_4_ = fVar213 * fVar121;
            auVar45._20_4_ = fVar215 * fVar122;
            auVar45._24_4_ = fVar217 * fVar129;
            auVar45._28_4_ = fVar90 + fVar111;
            auVar27 = vsubps_avx(auVar45,auVar44);
            local_14a0._0_4_ =
                 local_17a0._4_4_ * auVar25._0_4_ +
                 local_17e0._4_4_ * auVar26._0_4_ + local_1700._4_4_ * auVar27._0_4_;
            local_14a0._4_4_ =
                 local_17a0._4_4_ * auVar25._4_4_ +
                 local_17e0._4_4_ * auVar26._4_4_ + local_1700._4_4_ * auVar27._4_4_;
            local_14a0._8_4_ =
                 local_17a0._4_4_ * auVar25._8_4_ +
                 local_17e0._4_4_ * auVar26._8_4_ + local_1700._4_4_ * auVar27._8_4_;
            local_14a0._12_4_ =
                 local_17a0._4_4_ * auVar25._12_4_ +
                 local_17e0._4_4_ * auVar26._12_4_ + local_1700._4_4_ * auVar27._12_4_;
            local_14a0._16_4_ =
                 local_17a0._4_4_ * auVar25._16_4_ +
                 local_17e0._4_4_ * auVar26._16_4_ + local_1700._4_4_ * auVar27._16_4_;
            local_14a0._20_4_ =
                 local_17a0._4_4_ * auVar25._20_4_ +
                 local_17e0._4_4_ * auVar26._20_4_ + local_1700._4_4_ * auVar27._20_4_;
            local_14a0._24_4_ =
                 local_17a0._4_4_ * auVar25._24_4_ +
                 local_17e0._4_4_ * auVar26._24_4_ + local_1700._4_4_ * auVar27._24_4_;
            local_14a0._28_4_ = auVar25._28_4_ + auVar26._28_4_ + auVar27._28_4_;
            auVar25 = vsubps_avx(auVar82,auVar21);
            fVar158 = auVar82._0_4_ + auVar21._0_4_;
            fVar159 = auVar82._4_4_ + auVar21._4_4_;
            fVar160 = auVar82._8_4_ + auVar21._8_4_;
            fVar161 = auVar82._12_4_ + auVar21._12_4_;
            fVar162 = auVar82._16_4_ + auVar21._16_4_;
            fVar90 = auVar82._20_4_ + auVar21._20_4_;
            fVar92 = auVar82._24_4_ + auVar21._24_4_;
            fVar94 = auVar82._28_4_ + auVar21._28_4_;
            auVar82 = vsubps_avx(auVar84,auVar22);
            fVar131 = auVar84._0_4_ + auVar22._0_4_;
            fVar133 = auVar84._4_4_ + auVar22._4_4_;
            fVar135 = auVar84._8_4_ + auVar22._8_4_;
            fVar137 = auVar84._12_4_ + auVar22._12_4_;
            fVar139 = auVar84._16_4_ + auVar22._16_4_;
            fVar152 = auVar84._20_4_ + auVar22._20_4_;
            fVar157 = auVar84._24_4_ + auVar22._24_4_;
            auVar21 = vsubps_avx(auVar142,auVar23);
            fVar119 = auVar23._0_4_ + auVar142._0_4_;
            fVar120 = auVar23._4_4_ + auVar142._4_4_;
            fVar121 = auVar23._8_4_ + auVar142._8_4_;
            fVar122 = auVar23._12_4_ + auVar142._12_4_;
            fVar129 = auVar23._16_4_ + auVar142._16_4_;
            fVar108 = auVar23._20_4_ + auVar142._20_4_;
            fVar110 = auVar23._24_4_ + auVar142._24_4_;
            fVar123 = auVar21._0_4_;
            fVar130 = auVar21._4_4_;
            auVar46._4_4_ = fVar130 * fVar133;
            auVar46._0_4_ = fVar123 * fVar131;
            fVar132 = auVar21._8_4_;
            auVar46._8_4_ = fVar132 * fVar135;
            fVar134 = auVar21._12_4_;
            auVar46._12_4_ = fVar134 * fVar137;
            fVar136 = auVar21._16_4_;
            auVar46._16_4_ = fVar136 * fVar139;
            fVar138 = auVar21._20_4_;
            auVar46._20_4_ = fVar138 * fVar152;
            fVar140 = auVar21._24_4_;
            auVar46._24_4_ = fVar140 * fVar157;
            auVar46._28_4_ = auVar25._28_4_;
            fVar169 = auVar82._0_4_;
            fVar172 = auVar82._4_4_;
            auVar47._4_4_ = fVar172 * fVar120;
            auVar47._0_4_ = fVar169 * fVar119;
            fVar174 = auVar82._8_4_;
            auVar47._8_4_ = fVar174 * fVar121;
            fVar176 = auVar82._12_4_;
            auVar47._12_4_ = fVar176 * fVar122;
            fVar178 = auVar82._16_4_;
            auVar47._16_4_ = fVar178 * fVar129;
            fVar180 = auVar82._20_4_;
            auVar47._20_4_ = fVar180 * fVar108;
            fVar182 = auVar82._24_4_;
            auVar47._24_4_ = fVar182 * fVar110;
            auVar47._28_4_ = fVar111;
            auVar82 = vsubps_avx(auVar47,auVar46);
            fVar117 = auVar25._0_4_;
            fVar118 = auVar25._4_4_;
            auVar48._4_4_ = fVar118 * fVar120;
            auVar48._0_4_ = fVar117 * fVar119;
            fVar119 = auVar25._8_4_;
            auVar48._8_4_ = fVar119 * fVar121;
            fVar120 = auVar25._12_4_;
            auVar48._12_4_ = fVar120 * fVar122;
            fVar121 = auVar25._16_4_;
            auVar48._16_4_ = fVar121 * fVar129;
            fVar122 = auVar25._20_4_;
            auVar48._20_4_ = fVar122 * fVar108;
            fVar129 = auVar25._24_4_;
            auVar48._24_4_ = fVar129 * fVar110;
            auVar48._28_4_ = auVar23._28_4_ + fVar116;
            auVar49._4_4_ = fVar130 * fVar159;
            auVar49._0_4_ = fVar123 * fVar158;
            auVar49._8_4_ = fVar132 * fVar160;
            auVar49._12_4_ = fVar134 * fVar161;
            auVar49._16_4_ = fVar136 * fVar162;
            auVar49._20_4_ = fVar138 * fVar90;
            auVar49._24_4_ = fVar140 * fVar92;
            auVar49._28_4_ = fVar111;
            auVar84 = vsubps_avx(auVar49,auVar48);
            auVar50._4_4_ = fVar172 * fVar159;
            auVar50._0_4_ = fVar169 * fVar158;
            auVar50._8_4_ = fVar174 * fVar160;
            auVar50._12_4_ = fVar176 * fVar161;
            auVar50._16_4_ = fVar178 * fVar162;
            auVar50._20_4_ = fVar180 * fVar90;
            auVar50._24_4_ = fVar182 * fVar92;
            auVar50._28_4_ = fVar94;
            auVar51._4_4_ = fVar118 * fVar133;
            auVar51._0_4_ = fVar117 * fVar131;
            auVar51._8_4_ = fVar119 * fVar135;
            auVar51._12_4_ = fVar120 * fVar137;
            auVar51._16_4_ = fVar121 * fVar139;
            auVar51._20_4_ = fVar122 * fVar152;
            auVar51._24_4_ = fVar129 * fVar157;
            auVar51._28_4_ = fVar111 + auVar22._28_4_;
            auVar142 = vsubps_avx(auVar51,auVar50);
            local_1700._0_4_ = local_1700._4_4_;
            fStack_16f8 = local_1700._4_4_;
            fStack_16f4 = local_1700._4_4_;
            fStack_16f0 = local_1700._4_4_;
            fStack_16ec = local_1700._4_4_;
            fStack_16e8 = local_1700._4_4_;
            fStack_16e4 = local_1700._4_4_;
            local_17e0._0_4_ = local_17e0._4_4_;
            fStack_17d8 = local_17e0._4_4_;
            fStack_17d4 = local_17e0._4_4_;
            fStack_17d0 = local_17e0._4_4_;
            fStack_17cc = local_17e0._4_4_;
            fStack_17c8 = local_17e0._4_4_;
            fStack_17c4 = local_17e0._4_4_;
            local_17a0._0_4_ = local_17a0._4_4_;
            fStack_1798 = local_17a0._4_4_;
            fStack_1794 = local_17a0._4_4_;
            fStack_1790 = local_17a0._4_4_;
            fStack_178c = local_17a0._4_4_;
            fStack_1788 = local_17a0._4_4_;
            fStack_1784 = local_17a0._4_4_;
            auVar86._0_4_ =
                 local_17a0._4_4_ * auVar82._0_4_ +
                 local_17e0._4_4_ * auVar84._0_4_ + local_1700._4_4_ * auVar142._0_4_;
            auVar86._4_4_ =
                 local_17a0._4_4_ * auVar82._4_4_ +
                 local_17e0._4_4_ * auVar84._4_4_ + local_1700._4_4_ * auVar142._4_4_;
            auVar86._8_4_ =
                 local_17a0._4_4_ * auVar82._8_4_ +
                 local_17e0._4_4_ * auVar84._8_4_ + local_1700._4_4_ * auVar142._8_4_;
            auVar86._12_4_ =
                 local_17a0._4_4_ * auVar82._12_4_ +
                 local_17e0._4_4_ * auVar84._12_4_ + local_1700._4_4_ * auVar142._12_4_;
            auVar86._16_4_ =
                 local_17a0._4_4_ * auVar82._16_4_ +
                 local_17e0._4_4_ * auVar84._16_4_ + local_1700._4_4_ * auVar142._16_4_;
            auVar86._20_4_ =
                 local_17a0._4_4_ * auVar82._20_4_ +
                 local_17e0._4_4_ * auVar84._20_4_ + local_1700._4_4_ * auVar142._20_4_;
            auVar86._24_4_ =
                 local_17a0._4_4_ * auVar82._24_4_ +
                 local_17e0._4_4_ * auVar84._24_4_ + local_1700._4_4_ * auVar142._24_4_;
            auVar86._28_4_ = fVar94 + fVar94 + auVar142._28_4_;
            local_14e0._0_4_ = auVar86._0_4_ + local_1720._0_4_ + local_14a0._0_4_;
            local_14e0._4_4_ = auVar86._4_4_ + local_1720._4_4_ + local_14a0._4_4_;
            local_14e0._8_4_ = auVar86._8_4_ + local_1720._8_4_ + local_14a0._8_4_;
            local_14e0._12_4_ = auVar86._12_4_ + local_1720._12_4_ + local_14a0._12_4_;
            local_14e0._16_4_ = auVar86._16_4_ + local_1720._16_4_ + local_14a0._16_4_;
            local_14e0._20_4_ = auVar86._20_4_ + local_1720._20_4_ + local_14a0._20_4_;
            local_14e0._24_4_ = auVar86._24_4_ + local_1720._24_4_ + local_14a0._24_4_;
            local_14e0._28_4_ = auVar86._28_4_ + local_1720._28_4_ + local_14a0._28_4_;
            auVar82 = vminps_avx(local_1720,local_14a0);
            auVar82 = vminps_avx(auVar82,auVar86);
            auVar99._8_4_ = 0x7fffffff;
            auVar99._0_8_ = 0x7fffffff7fffffff;
            auVar99._12_4_ = 0x7fffffff;
            auVar99._16_4_ = 0x7fffffff;
            auVar99._20_4_ = 0x7fffffff;
            auVar99._24_4_ = 0x7fffffff;
            auVar99._28_4_ = 0x7fffffff;
            local_14c0 = vandps_avx(local_14e0,auVar99);
            fVar111 = local_14c0._0_4_ * 1.1920929e-07;
            fVar116 = local_14c0._4_4_ * 1.1920929e-07;
            auVar52._4_4_ = fVar116;
            auVar52._0_4_ = fVar111;
            fVar131 = local_14c0._8_4_ * 1.1920929e-07;
            auVar52._8_4_ = fVar131;
            fVar133 = local_14c0._12_4_ * 1.1920929e-07;
            auVar52._12_4_ = fVar133;
            fVar135 = local_14c0._16_4_ * 1.1920929e-07;
            auVar52._16_4_ = fVar135;
            fVar137 = local_14c0._20_4_ * 1.1920929e-07;
            auVar52._20_4_ = fVar137;
            fVar139 = local_14c0._24_4_ * 1.1920929e-07;
            auVar52._24_4_ = fVar139;
            auVar52._28_4_ = 0x34000000;
            auVar154._0_8_ = CONCAT44(fVar116,fVar111) ^ 0x8000000080000000;
            auVar154._8_4_ = -fVar131;
            auVar154._12_4_ = -fVar133;
            auVar154._16_4_ = -fVar135;
            auVar154._20_4_ = -fVar137;
            auVar154._24_4_ = -fVar139;
            auVar154._28_4_ = 0xb4000000;
            auVar82 = vcmpps_avx(auVar82,auVar154,5);
            auVar142 = vmaxps_avx(local_1720,local_14a0);
            auVar84 = vmaxps_avx(auVar142,auVar86);
            auVar84 = vcmpps_avx(auVar84,auVar52,2);
            auVar84 = vorps_avx(auVar82,auVar84);
            if ((((((((auVar84 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar84 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar84 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar84 >> 0x7f,0) == '\0') &&
                  (auVar84 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar84 >> 0xbf,0) == '\0') &&
                (auVar84 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar84[0x1f]) {
LAB_002ec259:
              auVar156 = ZEXT3264(local_1500);
              auVar163 = ZEXT3264(local_1520);
              auVar165 = ZEXT3264(local_1540);
              auVar167 = ZEXT3264(local_1560);
              auVar170 = ZEXT3264(local_1580);
              auVar186 = ZEXT3264(local_15a0);
              auVar200 = ZEXT3264(local_15c0);
              auVar115 = ZEXT3264(local_15e0);
              auVar102 = ZEXT3264(local_1600);
              auVar128 = ZEXT3264(local_1620);
              auVar145 = ZEXT3264(local_1640);
              auVar202 = ZEXT3264(local_1660);
            }
            else {
              auVar53._4_4_ = fVar171 * fVar146;
              auVar53._0_4_ = fVar168 * fVar141;
              auVar53._8_4_ = fVar173 * fVar147;
              auVar53._12_4_ = fVar175 * fVar148;
              auVar53._16_4_ = fVar177 * fVar149;
              auVar53._20_4_ = fVar179 * fVar150;
              auVar53._24_4_ = fVar181 * fVar151;
              auVar53._28_4_ = auVar82._28_4_;
              auVar54._4_4_ = fVar187 * fVar188;
              auVar54._0_4_ = fVar183 * fVar184;
              auVar54._8_4_ = fVar189 * fVar190;
              auVar54._12_4_ = fVar191 * fVar192;
              auVar54._16_4_ = fVar193 * fVar194;
              auVar54._20_4_ = fVar195 * fVar196;
              auVar54._24_4_ = fVar197 * fVar198;
              auVar54._28_4_ = 0x34000000;
              auVar22 = vsubps_avx(auVar54,auVar53);
              auVar55._4_4_ = fVar188 * fVar172;
              auVar55._0_4_ = fVar184 * fVar169;
              auVar55._8_4_ = fVar190 * fVar174;
              auVar55._12_4_ = fVar192 * fVar176;
              auVar55._16_4_ = fVar194 * fVar178;
              auVar55._20_4_ = fVar196 * fVar180;
              auVar55._24_4_ = fVar198 * fVar182;
              auVar55._28_4_ = auVar142._28_4_;
              auVar56._4_4_ = fVar171 * fVar130;
              auVar56._0_4_ = fVar168 * fVar123;
              auVar56._8_4_ = fVar173 * fVar132;
              auVar56._12_4_ = fVar175 * fVar134;
              auVar56._16_4_ = fVar177 * fVar136;
              auVar56._20_4_ = fVar179 * fVar138;
              auVar56._24_4_ = fVar181 * fVar140;
              auVar56._28_4_ = auVar24._28_4_;
              auVar23 = vsubps_avx(auVar56,auVar55);
              auVar114._8_4_ = 0x7fffffff;
              auVar114._0_8_ = 0x7fffffff7fffffff;
              auVar114._12_4_ = 0x7fffffff;
              auVar114._16_4_ = 0x7fffffff;
              auVar114._20_4_ = 0x7fffffff;
              auVar114._24_4_ = 0x7fffffff;
              auVar114._28_4_ = 0x7fffffff;
              auVar82 = vandps_avx(auVar53,auVar114);
              auVar142 = vandps_avx(auVar55,auVar114);
              auVar82 = vcmpps_avx(auVar82,auVar142,1);
              local_1360 = vblendvps_avx(auVar23,auVar22,auVar82);
              auVar57._4_4_ = fVar207 * fVar130;
              auVar57._0_4_ = fVar204 * fVar123;
              auVar57._8_4_ = fVar209 * fVar132;
              auVar57._12_4_ = fVar211 * fVar134;
              auVar57._16_4_ = fVar213 * fVar136;
              auVar57._20_4_ = fVar215 * fVar138;
              auVar57._24_4_ = fVar217 * fVar140;
              auVar57._28_4_ = auVar82._28_4_;
              auVar58._4_4_ = fVar207 * fVar146;
              auVar58._0_4_ = fVar204 * fVar141;
              auVar58._8_4_ = fVar209 * fVar147;
              auVar58._12_4_ = fVar211 * fVar148;
              auVar58._16_4_ = fVar213 * fVar149;
              auVar58._20_4_ = fVar215 * fVar150;
              auVar58._24_4_ = fVar217 * fVar151;
              auVar58._28_4_ = auVar22._28_4_;
              auVar59._4_4_ = fVar103 * fVar188;
              auVar59._0_4_ = fVar96 * fVar184;
              auVar59._8_4_ = fVar104 * fVar190;
              auVar59._12_4_ = fVar105 * fVar192;
              auVar59._16_4_ = fVar106 * fVar194;
              auVar59._20_4_ = fVar107 * fVar196;
              auVar59._24_4_ = fVar109 * fVar198;
              auVar59._28_4_ = local_1460._28_4_;
              auVar22 = vsubps_avx(auVar58,auVar59);
              auVar60._4_4_ = fVar188 * fVar118;
              auVar60._0_4_ = fVar184 * fVar117;
              auVar60._8_4_ = fVar190 * fVar119;
              auVar60._12_4_ = fVar192 * fVar120;
              auVar60._16_4_ = fVar194 * fVar121;
              auVar60._20_4_ = fVar196 * fVar122;
              auVar60._24_4_ = fVar198 * fVar129;
              auVar60._28_4_ = auVar142._28_4_;
              auVar23 = vsubps_avx(auVar60,auVar57);
              auVar82 = vandps_avx(auVar59,auVar114);
              auVar142 = vandps_avx(auVar57,auVar114);
              auVar82 = vcmpps_avx(auVar82,auVar142,1);
              local_1340 = vblendvps_avx(auVar23,auVar22,auVar82);
              auVar155._8_4_ = 0x3f800000;
              auVar155._0_8_ = 0x3f8000003f800000;
              auVar155._12_4_ = 0x3f800000;
              auVar155._16_4_ = 0x3f800000;
              auVar155._20_4_ = 0x3f800000;
              auVar155._24_4_ = 0x3f800000;
              auVar155._28_4_ = 0x3f800000;
              auVar61._4_4_ = fVar171 * fVar118;
              auVar61._0_4_ = fVar168 * fVar117;
              auVar61._8_4_ = fVar173 * fVar119;
              auVar61._12_4_ = fVar175 * fVar120;
              auVar61._16_4_ = fVar177 * fVar121;
              auVar61._20_4_ = fVar179 * fVar122;
              auVar61._24_4_ = fVar181 * fVar129;
              auVar61._28_4_ = auVar82._28_4_;
              auVar62._4_4_ = fVar103 * fVar171;
              auVar62._0_4_ = fVar96 * fVar168;
              auVar62._8_4_ = fVar104 * fVar173;
              auVar62._12_4_ = fVar105 * fVar175;
              auVar62._16_4_ = fVar106 * fVar177;
              auVar62._20_4_ = fVar107 * fVar179;
              auVar62._24_4_ = fVar109 * fVar181;
              auVar62._28_4_ = auVar22._28_4_;
              auVar63._4_4_ = fVar187 * fVar207;
              auVar63._0_4_ = fVar183 * fVar204;
              auVar63._8_4_ = fVar189 * fVar209;
              auVar63._12_4_ = fVar191 * fVar211;
              auVar63._16_4_ = fVar193 * fVar213;
              auVar63._20_4_ = fVar195 * fVar215;
              auVar63._24_4_ = fVar197 * fVar217;
              auVar63._28_4_ = auVar21._28_4_;
              auVar64._4_4_ = fVar207 * fVar172;
              auVar64._0_4_ = fVar204 * fVar169;
              auVar64._8_4_ = fVar209 * fVar174;
              auVar64._12_4_ = fVar211 * fVar176;
              auVar64._16_4_ = fVar213 * fVar178;
              auVar64._20_4_ = fVar215 * fVar180;
              auVar64._24_4_ = fVar217 * fVar182;
              auVar64._28_4_ = auVar25._28_4_;
              auVar21 = vsubps_avx(auVar62,auVar63);
              auVar22 = vsubps_avx(auVar64,auVar61);
              auVar82 = vandps_avx(auVar63,auVar114);
              auVar142 = vandps_avx(auVar61,auVar114);
              auVar142 = vcmpps_avx(auVar82,auVar142,1);
              local_1320 = vblendvps_avx(auVar22,auVar21,auVar142);
              auVar81 = vpackssdw_avx(auVar84._0_16_,auVar84._16_16_);
              fVar116 = local_1320._0_4_;
              fVar117 = local_1320._4_4_;
              fVar118 = local_1320._8_4_;
              fVar119 = local_1320._12_4_;
              fVar120 = local_1320._16_4_;
              fVar121 = local_1320._20_4_;
              fVar122 = local_1320._24_4_;
              fVar157 = local_1340._0_4_;
              fVar158 = local_1340._4_4_;
              fVar159 = local_1340._8_4_;
              fVar160 = local_1340._12_4_;
              fVar161 = local_1340._16_4_;
              fVar162 = local_1340._20_4_;
              fVar90 = local_1340._24_4_;
              fVar92 = local_1360._0_4_;
              fVar94 = local_1360._4_4_;
              fVar96 = local_1360._8_4_;
              fVar103 = local_1360._12_4_;
              fVar104 = local_1360._16_4_;
              fVar105 = local_1360._20_4_;
              fVar106 = local_1360._24_4_;
              fVar111 = fVar92 * local_17a0._4_4_ +
                        fVar157 * local_17e0._4_4_ + fVar116 * local_1700._4_4_;
              fVar129 = fVar94 * local_17a0._4_4_ +
                        fVar158 * local_17e0._4_4_ + fVar117 * local_1700._4_4_;
              fVar131 = fVar96 * local_17a0._4_4_ +
                        fVar159 * local_17e0._4_4_ + fVar118 * local_1700._4_4_;
              fVar133 = fVar103 * local_17a0._4_4_ +
                        fVar160 * local_17e0._4_4_ + fVar119 * local_1700._4_4_;
              fVar135 = fVar104 * local_17a0._4_4_ +
                        fVar161 * local_17e0._4_4_ + fVar120 * local_1700._4_4_;
              fVar137 = fVar105 * local_17a0._4_4_ +
                        fVar162 * local_17e0._4_4_ + fVar121 * local_1700._4_4_;
              fVar139 = fVar106 * local_17a0._4_4_ +
                        fVar90 * local_17e0._4_4_ + fVar122 * local_1700._4_4_;
              fVar152 = auVar21._28_4_ + auVar21._28_4_ + 0.0;
              auVar100._0_4_ = fVar111 + fVar111;
              auVar100._4_4_ = fVar129 + fVar129;
              auVar100._8_4_ = fVar131 + fVar131;
              auVar100._12_4_ = fVar133 + fVar133;
              auVar100._16_4_ = fVar135 + fVar135;
              auVar100._20_4_ = fVar137 + fVar137;
              auVar100._24_4_ = fVar139 + fVar139;
              auVar100._28_4_ = fVar152 + fVar152;
              fVar111 = auVar82._28_4_;
              auVar82 = vrcpps_avx(auVar100);
              fVar129 = fVar92 * fVar12 + fVar157 * fVar203 + fVar116 * fVar1;
              fVar131 = fVar94 * fVar14 + fVar158 * fVar206 + fVar117 * fVar13;
              fVar133 = fVar96 * fVar16 + fVar159 * fVar208 + fVar118 * fVar15;
              fVar88 = fVar103 * fVar88 + fVar160 * fVar210 + fVar119 * fVar17;
              fVar89 = fVar104 * fVar91 + fVar161 * fVar212 + fVar120 * fVar89;
              fVar91 = fVar105 * fVar95 + fVar162 * fVar214 + fVar121 * fVar93;
              fVar93 = fVar106 * fVar19 + fVar90 * fVar216 + fVar122 * fVar18;
              fVar95 = fVar111 + fVar111 + fVar152;
              fVar1 = auVar82._0_4_;
              fVar12 = auVar82._4_4_;
              auVar65._4_4_ = auVar100._4_4_ * fVar12;
              auVar65._0_4_ = auVar100._0_4_ * fVar1;
              fVar13 = auVar82._8_4_;
              auVar65._8_4_ = auVar100._8_4_ * fVar13;
              fVar14 = auVar82._12_4_;
              auVar65._12_4_ = auVar100._12_4_ * fVar14;
              fVar15 = auVar82._16_4_;
              auVar65._16_4_ = auVar100._16_4_ * fVar15;
              fVar16 = auVar82._20_4_;
              auVar65._20_4_ = auVar100._20_4_ * fVar16;
              fVar17 = auVar82._24_4_;
              auVar65._24_4_ = auVar100._24_4_ * fVar17;
              auVar65._28_4_ = fVar111;
              auVar82 = vsubps_avx(auVar155,auVar65);
              uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
              auVar143._4_4_ = uVar2;
              auVar143._0_4_ = uVar2;
              auVar143._8_4_ = uVar2;
              auVar143._12_4_ = uVar2;
              auVar143._16_4_ = uVar2;
              auVar143._20_4_ = uVar2;
              auVar143._24_4_ = uVar2;
              auVar143._28_4_ = uVar2;
              local_12a0._4_4_ = (fVar131 + fVar131) * (fVar12 + fVar12 * auVar82._4_4_);
              local_12a0._0_4_ = (fVar129 + fVar129) * (fVar1 + fVar1 * auVar82._0_4_);
              local_12a0._8_4_ = (fVar133 + fVar133) * (fVar13 + fVar13 * auVar82._8_4_);
              local_12a0._12_4_ = (fVar88 + fVar88) * (fVar14 + fVar14 * auVar82._12_4_);
              local_12a0._16_4_ = (fVar89 + fVar89) * (fVar15 + fVar15 * auVar82._16_4_);
              local_12a0._20_4_ = (fVar91 + fVar91) * (fVar16 + fVar16 * auVar82._20_4_);
              local_12a0._24_4_ = (fVar93 + fVar93) * (fVar17 + fVar17 * auVar82._24_4_);
              local_12a0._28_4_ = fVar95 + fVar95;
              auVar82 = vcmpps_avx(auVar143,local_12a0,2);
              fVar1 = ray->tfar;
              auVar144._4_4_ = fVar1;
              auVar144._0_4_ = fVar1;
              auVar144._8_4_ = fVar1;
              auVar144._12_4_ = fVar1;
              auVar144._16_4_ = fVar1;
              auVar144._20_4_ = fVar1;
              auVar144._24_4_ = fVar1;
              auVar144._28_4_ = fVar1;
              auVar84 = vcmpps_avx(local_12a0,auVar144,2);
              auVar82 = vandps_avx(auVar84,auVar82);
              auVar84 = vcmpps_avx(auVar100,_DAT_01faff00,4);
              auVar82 = vandps_avx(auVar82,auVar84);
              auVar124 = vpackssdw_avx(auVar82._0_16_,auVar82._16_16_);
              auVar81 = vpand_avx(auVar124,auVar81);
              auVar124 = vpmovsxwd_avx(auVar81);
              auVar20 = vpshufd_avx(auVar81,0xee);
              auVar20 = vpmovsxwd_avx(auVar20);
              local_1300._16_16_ = auVar20;
              local_1300._0_16_ = auVar124;
              if ((((((((local_1300 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (local_1300 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_1300 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_1300 >> 0x7f,0) == '\0') &&
                    (local_1300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB161(auVar20 >> 0x3f,0) == '\0') &&
                  (local_1300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar20[0xf]) goto LAB_002ec259;
              local_13c0 = local_1720._0_4_;
              fStack_13bc = local_1720._4_4_;
              fStack_13b8 = local_1720._8_4_;
              fStack_13b4 = local_1720._12_4_;
              fStack_13b0 = local_1720._16_4_;
              fStack_13ac = local_1720._20_4_;
              fStack_13a8 = local_1720._24_4_;
              fStack_13a4 = local_1720._28_4_;
              local_13a0 = local_14a0._0_4_;
              fStack_139c = local_14a0._4_4_;
              fStack_1398 = local_14a0._8_4_;
              fStack_1394 = local_14a0._12_4_;
              fStack_1390 = local_14a0._16_4_;
              fStack_138c = local_14a0._20_4_;
              fStack_1388 = local_14a0._24_4_;
              fStack_1384 = local_14a0._28_4_;
              local_1380 = local_14e0;
              auVar145 = ZEXT3264(local_1640);
              local_1220 = local_1640;
              auVar82 = vrcpps_avx(local_14e0);
              fVar1 = auVar82._0_4_;
              fVar12 = auVar82._4_4_;
              auVar66._4_4_ = local_14e0._4_4_ * fVar12;
              auVar66._0_4_ = local_14e0._0_4_ * fVar1;
              fVar13 = auVar82._8_4_;
              auVar66._8_4_ = local_14e0._8_4_ * fVar13;
              fVar14 = auVar82._12_4_;
              auVar66._12_4_ = local_14e0._12_4_ * fVar14;
              fVar15 = auVar82._16_4_;
              auVar66._16_4_ = local_14e0._16_4_ * fVar15;
              fVar16 = auVar82._20_4_;
              auVar66._20_4_ = local_14e0._20_4_ * fVar16;
              fVar17 = auVar82._24_4_;
              auVar66._24_4_ = local_14e0._24_4_ * fVar17;
              auVar66._28_4_ = auVar20._12_4_;
              auVar84 = vsubps_avx(auVar155,auVar66);
              auVar87._0_4_ = fVar1 + fVar1 * auVar84._0_4_;
              auVar87._4_4_ = fVar12 + fVar12 * auVar84._4_4_;
              auVar87._8_4_ = fVar13 + fVar13 * auVar84._8_4_;
              auVar87._12_4_ = fVar14 + fVar14 * auVar84._12_4_;
              auVar87._16_4_ = fVar15 + fVar15 * auVar84._16_4_;
              auVar87._20_4_ = fVar16 + fVar16 * auVar84._20_4_;
              auVar87._24_4_ = fVar17 + fVar17 * auVar84._24_4_;
              auVar87._28_4_ = auVar82._28_4_ + auVar84._28_4_;
              auVar101._8_4_ = 0x219392ef;
              auVar101._0_8_ = 0x219392ef219392ef;
              auVar101._12_4_ = 0x219392ef;
              auVar101._16_4_ = 0x219392ef;
              auVar101._20_4_ = 0x219392ef;
              auVar101._24_4_ = 0x219392ef;
              auVar101._28_4_ = 0x219392ef;
              auVar84 = vcmpps_avx(local_14c0,auVar101,5);
              auVar82 = vandps_avx(auVar84,auVar87);
              auVar67._4_4_ = local_1720._4_4_ * auVar82._4_4_;
              auVar67._0_4_ = local_1720._0_4_ * auVar82._0_4_;
              auVar67._8_4_ = local_1720._8_4_ * auVar82._8_4_;
              auVar67._12_4_ = local_1720._12_4_ * auVar82._12_4_;
              auVar67._16_4_ = local_1720._16_4_ * auVar82._16_4_;
              auVar67._20_4_ = local_1720._20_4_ * auVar82._20_4_;
              auVar67._24_4_ = local_1720._24_4_ * auVar82._24_4_;
              auVar67._28_4_ = auVar84._28_4_;
              auVar84 = vminps_avx(auVar67,auVar155);
              auVar68._4_4_ = local_14a0._4_4_ * auVar82._4_4_;
              auVar68._0_4_ = local_14a0._0_4_ * auVar82._0_4_;
              auVar68._8_4_ = local_14a0._8_4_ * auVar82._8_4_;
              auVar68._12_4_ = local_14a0._12_4_ * auVar82._12_4_;
              auVar68._16_4_ = local_14a0._16_4_ * auVar82._16_4_;
              auVar68._20_4_ = local_14a0._20_4_ * auVar82._20_4_;
              auVar68._24_4_ = local_14a0._24_4_ * auVar82._24_4_;
              auVar68._28_4_ = auVar82._28_4_;
              auVar82 = vminps_avx(auVar68,auVar155);
              auVar142 = vsubps_avx(auVar155,auVar84);
              auVar21 = vsubps_avx(auVar155,auVar82);
              local_12c0 = vblendvps_avx(auVar82,auVar142,local_1640);
              local_12e0 = vblendvps_avx(auVar84,auVar21,local_1640);
              local_1280._4_4_ = fVar94 * (float)local_1420._4_4_;
              local_1280._0_4_ = fVar92 * (float)local_1420._0_4_;
              local_1280._8_4_ = fVar96 * fStack_1418;
              local_1280._12_4_ = fVar103 * fStack_1414;
              local_1280._16_4_ = fVar104 * fStack_1410;
              local_1280._20_4_ = fVar105 * fStack_140c;
              local_1280._24_4_ = fVar106 * fStack_1408;
              local_1280._28_4_ = local_12c0._28_4_;
              local_1260[0] = fVar157 * (float)local_1420._0_4_;
              local_1260[1] = fVar158 * (float)local_1420._4_4_;
              local_1260[2] = fVar159 * fStack_1418;
              local_1260[3] = fVar160 * fStack_1414;
              fStack_1250 = fVar161 * fStack_1410;
              fStack_124c = fVar162 * fStack_140c;
              fStack_1248 = fVar90 * fStack_1408;
              uStack_1244 = local_12e0._28_4_;
              local_1240[0] = (float)local_1420._0_4_ * fVar116;
              local_1240[1] = (float)local_1420._4_4_ * fVar117;
              local_1240[2] = fStack_1418 * fVar118;
              local_1240[3] = fStack_1414 * fVar119;
              fStack_1230 = fStack_1410 * fVar120;
              fStack_122c = fStack_140c * fVar121;
              fStack_1228 = fStack_1408 * fVar122;
              uStack_1224 = local_1320._28_4_;
              auVar81 = vpsllw_avx(auVar81,0xf);
              auVar81 = vpacksswb_avx(auVar81,auVar81);
              uVar69 = (ulong)(byte)(SUB161(auVar81 >> 7,0) & 1 |
                                     (SUB161(auVar81 >> 0xf,0) & 1) << 1 |
                                     (SUB161(auVar81 >> 0x17,0) & 1) << 2 |
                                     (SUB161(auVar81 >> 0x1f,0) & 1) << 3 |
                                     (SUB161(auVar81 >> 0x27,0) & 1) << 4 |
                                     (SUB161(auVar81 >> 0x2f,0) & 1) << 5 |
                                     (SUB161(auVar81 >> 0x37,0) & 1) << 6 |
                                    SUB161(auVar81 >> 0x3f,0) << 7);
              auVar156 = ZEXT3264(local_1500);
              auVar163 = ZEXT3264(local_1520);
              auVar165 = ZEXT3264(local_1540);
              auVar167 = ZEXT3264(local_1560);
              auVar170 = ZEXT3264(local_1580);
              auVar186 = ZEXT3264(local_15a0);
              auVar200 = ZEXT3264(local_15c0);
              auVar115 = ZEXT3264(local_15e0);
              auVar102 = ZEXT3264(local_1600);
              auVar128 = ZEXT3264(local_1620);
              auVar202 = ZEXT3264(local_1660);
              local_1460 = auVar35;
              do {
                uVar72 = 0;
                if (uVar69 != 0) {
                  for (; (uVar69 >> uVar72 & 1) == 0; uVar72 = uVar72 + 1) {
                  }
                }
                local_1768 = *(uint *)((long)&local_13e0 + uVar72 * 4);
                uVar76 = CONCAT44(0,local_1768);
                local_17e0 = uVar76;
                pGVar10 = (pSVar4->geometries).items[uVar76].ptr;
                if ((pGVar10->mask & ray->mask) == 0) {
                  uVar69 = uVar69 ^ 1L << (uVar72 & 0x3f);
                }
                else {
                  local_17a0 = uVar72;
                  pRVar75 = context->args;
                  if ((pRVar75->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_002ec2f8;
                  local_16a0._0_8_ = uVar69;
                  local_1680._0_8_ = uVar78;
                  local_1720._0_8_ = puVar77;
                  local_1700 = context;
                  local_1750.context = context->user;
                  local_1780 = *(undefined4 *)(local_1280 + uVar72 * 4);
                  local_177c = local_1260[uVar72];
                  local_1778 = local_1240[uVar72];
                  local_1774 = *(undefined4 *)(local_12e0 + uVar72 * 4);
                  local_1770 = *(undefined4 *)(local_12c0 + uVar72 * 4);
                  local_176c = *(undefined4 *)((long)&local_1400 + uVar72 * 4);
                  local_1764 = (local_1750.context)->instID[0];
                  local_1760 = (local_1750.context)->instPrimID[0];
                  local_17e0._0_4_ = ray->tfar;
                  ray->tfar = *(float *)(local_12a0 + uVar72 * 4);
                  local_17e4 = -1;
                  local_1750.valid = &local_17e4;
                  local_1750.geometryUserPtr = pGVar10->userPtr;
                  local_1750.hit = (RTCHitN *)&local_1780;
                  local_1750.N = 1;
                  local_16c0._0_8_ = pGVar10;
                  local_1750.ray = (RTCRayN *)ray;
                  if (pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_002ec14d:
                    if ((pRVar75->filter == (RTCFilterFunctionN)0x0) ||
                       ((((pRVar75->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT &&
                         ((*(byte *)(local_16c0._0_8_ + 0x3e) & 0x40) == 0)) ||
                        ((*pRVar75->filter)(&local_1750), *local_1750.valid != 0)))) {
LAB_002ec2f8:
                      ray->tfar = -INFINITY;
                      return;
                    }
                  }
                  else {
                    local_16e0._0_8_ = pRVar75;
                    (*pGVar10->occlusionFilterN)(&local_1750);
                    pRVar75 = (RTCIntersectArguments *)local_16e0._0_8_;
                    if (*local_1750.valid != 0) goto LAB_002ec14d;
                  }
                  ray->tfar = (float)local_17e0;
                  uVar69 = local_16a0._0_8_ ^ 1L << (local_17a0 & 0x3f);
                  auVar156 = ZEXT3264(local_1500);
                  auVar163 = ZEXT3264(local_1520);
                  auVar165 = ZEXT3264(local_1540);
                  auVar167 = ZEXT3264(local_1560);
                  auVar170 = ZEXT3264(local_1580);
                  auVar186 = ZEXT3264(local_15a0);
                  auVar200 = ZEXT3264(local_15c0);
                  auVar115 = ZEXT3264(local_15e0);
                  auVar102 = ZEXT3264(local_1600);
                  auVar128 = ZEXT3264(local_1620);
                  auVar145 = ZEXT3264(local_1640);
                  auVar202 = ZEXT3264(local_1660);
                  context = local_1700;
                  puVar77 = (ulong *)local_1720._0_8_;
                  uVar78 = local_1680._0_8_;
                }
              } while (uVar69 != 0);
            }
            local_17a8 = local_17a8 + 1;
          } while (local_17a8 != local_17b0);
        }
LAB_002ec2e5:
      } while (puVar77 != &local_1200);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }